

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char32_t *
fmt::v8::detail::format_uint<1u,char32_t,unsigned_int>
          (char32_t *buffer,uint value,int num_digits,bool upper)

{
  bool bVar1;
  char32_t *pcVar2;
  ulong uVar3;
  
  pcVar2 = buffer + num_digits;
  uVar3 = (ulong)value;
  do {
    pcVar2 = pcVar2 + -1;
    *pcVar2 = value & 1 | 0x30;
    uVar3 = uVar3 >> 1;
    bVar1 = 1 < value;
    value = (uint)uVar3;
  } while (bVar1);
  return buffer + num_digits;
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}